

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O3

void __thiscall helics::apps::Recorder::initialize(Recorder *this)

{
  element_type *peVar1;
  pointer pVVar2;
  _Rb_tree_node_base *p_Var3;
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterInitializingModeIterative
            ((Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]));
  generateInterfaces(this);
  CLI::std::
  vector<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>::
  resize(&this->vStat,(this->subids)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (p_Var3 = (this->subkeys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(this->subkeys)._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
    pVVar2 = (this->vStat).
             super__Vector_base<helics::apps::Recorder::ValueStats,_std::allocator<helics::apps::Recorder::ValueStats>_>
             ._M_impl.super__Vector_impl_data._M_start;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              (&pVVar2[*(int *)&p_Var3[1]._M_left].key,0,
               pVVar2[*(int *)&p_Var3[1]._M_left].key._M_string_length,(char *)p_Var3[1]._M_parent,
               *(size_type *)(p_Var3 + 1));
  }
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterInitializingMode
            ((Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]));
  captureForCurrentTime(this,(Time)0xffffffffc4653600,0);
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  Federate::enterExecutingMode
            ((Federate *)
             ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
             (long)(peVar1->super_ValueFederate)._vptr_ValueFederate[-3]),NO_ITERATIONS);
  captureForCurrentTime(this,(Time)0x0,0);
  return;
}

Assistant:

void Recorder::initialize()
{
    fed->enterInitializingModeIterative();
    generateInterfaces();

    vStat.resize(subids.size());
    for (auto& val : subkeys) {
        vStat[val.second].key = val.first;
    }

    fed->enterInitializingMode();
    captureForCurrentTime(-1.0);

    fed->enterExecutingMode();
    captureForCurrentTime(0.0);
}